

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlyphBoundaries.cpp
# Opt level: O1

void __thiscall
GlyphBoundaries::UnnormalizeSumAndDiff
          (GlyphBoundaries *this,float dSum,float dDiff,int *pmSum,int *pmDiff)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  
  iVar2 = this->m_myBbMin;
  iVar3 = this->m_mxBbMax;
  iVar1 = iVar2 + this->m_mxBbMin;
  iVar4 = this->m_mxBbMin - this->m_myBbMax;
  *pmSum = (int)((float)((iVar3 - iVar1) + this->m_myBbMax) * dSum) + iVar1;
  *pmDiff = (int)((float)(iVar3 - (iVar2 + iVar4)) * dDiff) + iVar4;
  return;
}

Assistant:

void GlyphBoundaries::UnnormalizeSumAndDiff(float dSum, float dDiff, int * pmSum, int * pmDiff)
{
	int mMinSum = m_mxBbMin + m_myBbMin;	// lower-left point
	int mMaxSum = m_mxBbMax + m_myBbMax;	// upper-right point
	int mMinDiff = m_mxBbMin - m_myBbMax;	// upper-left point
	int mMaxDiff = m_mxBbMax - m_myBbMin;	// lower-right point

	int mSumScale = mMaxSum - mMinSum;
	int mDiffScale = mMaxDiff - mMinDiff;
	Assert(mSumScale == mDiffScale);

	*pmSum = (int)(dSum * mSumScale) + mMinSum;
	*pmDiff = (int)(dDiff * mDiffScale) + mMinDiff;
}